

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::reporters::Reporter_testRemoteReporter_Test::~Reporter_testRemoteReporter_Test
          (Reporter_testRemoteReporter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Reporter, testRemoteReporter)
{
    std::vector<Span> spans;
    std::mutex mutex;
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    constexpr auto kFixedQueueSize = 10;
    RemoteReporter reporter(
        std::chrono::milliseconds(1),
        kFixedQueueSize,
        std::unique_ptr<Sender>(new FakeTransport(spans, mutex)),
        *logger,
        *metrics);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
        // TODO(isaachier): Find a way to make this test more rigorous.
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }
    reporter.close();
    ASSERT_EQ(spans.size(), kNumReports);
}